

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

void * dja::mat4::memcpy(void *__dest,void *__src,size_t __n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  
  iVar16 = (int)__n;
  uVar1 = *(undefined4 *)((long)__src + 0x14);
  uVar2 = *(undefined4 *)((long)__src + 0x28);
  uVar3 = *(undefined4 *)((long)__src + 0x3c);
  *(undefined4 *)__dest = *__src;
  uVar4 = *(uint *)((long)__src + 4);
  uVar5 = *(uint *)((long)__src + 8);
  uVar6 = *(uint *)((long)__src + 0xc);
  uVar7 = *(uint *)((long)__src + 0x10);
  uVar17 = (iVar16 << 0x1f) >> 0x1f;
  uVar18 = (iVar16 << 0x1f) >> 0x1f;
  uVar19 = (iVar16 << 0x1f) >> 0x1f;
  uVar20 = (iVar16 << 0x1f) >> 0x1f;
  *(undefined4 *)((long)__dest + 0x14) = uVar1;
  uVar8 = *(uint *)((long)__src + 0x18);
  uVar9 = *(uint *)((long)__src + 0x1c);
  uVar10 = *(uint *)((long)__src + 0x20);
  uVar11 = *(uint *)((long)__src + 0x24);
  *(undefined4 *)((long)__dest + 0x28) = uVar2;
  uVar12 = *(uint *)((long)__src + 0x2c);
  uVar13 = *(uint *)((long)__src + 0x30);
  uVar14 = *(uint *)((long)__src + 0x34);
  uVar15 = *(uint *)((long)__src + 0x38);
  *(uint *)((long)__dest + 4) = uVar4 & uVar17 | ~uVar17 & uVar7;
  *(uint *)((long)__dest + 8) = uVar5 & uVar18 | ~uVar18 & uVar10;
  *(uint *)((long)__dest + 0xc) = uVar6 & uVar19 | ~uVar19 & uVar13;
  *(uint *)((long)__dest + 0x10) = uVar7 & uVar20 | ~uVar20 & uVar4;
  *(uint *)((long)__dest + 0x18) = ~uVar17 & uVar11 | uVar8 & uVar17;
  *(uint *)((long)__dest + 0x1c) = ~uVar18 & uVar14 | uVar9 & uVar18;
  *(uint *)((long)__dest + 0x20) = ~uVar19 & uVar5 | uVar10 & uVar19;
  *(uint *)((long)__dest + 0x24) = ~uVar20 & uVar8 | uVar11 & uVar20;
  *(uint *)((long)__dest + 0x2c) = ~uVar17 & uVar15 | uVar12 & uVar17;
  *(uint *)((long)__dest + 0x30) = ~uVar18 & uVar6 | uVar13 & uVar18;
  *(uint *)((long)__dest + 0x34) = ~uVar19 & uVar9 | uVar14 & uVar19;
  *(uint *)((long)__dest + 0x38) = ~uVar20 & uVar12 | uVar15 & uVar20;
  *(undefined4 *)((long)__dest + 0x3c) = uVar3;
  return __dest;
}

Assistant:

mat4 mat4::memcpy(const float_t *v, bool rowmajor)
{
    mat4 m;
    std::memcpy(&m[0][0], v, sizeof(mat4));
    return rowmajor ? m : transpose(m);
}